

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

bool __thiscall DataFilters::isFiltered(DataFilters *this,DataVector *data)

{
  bool bVar1;
  size_type sVar2;
  pointer pNVar3;
  const_reference pvVar4;
  pointer pNVar5;
  __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
  local_38;
  __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
  local_30;
  const_iterator it;
  uint size;
  DataVector *data_local;
  DataFilters *this_local;
  
  sVar2 = std::vector<DataPoint,_std::allocator<DataPoint>_>::size
                    (&data->super_vector<DataPoint,_std::allocator<DataPoint>_>);
  it._M_current._4_4_ = (uint)sVar2;
  sVar2 = std::
          vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
          size(&this->_numericFilters);
  if (sVar2 == 0) {
    this_local._7_1_ = true;
  }
  else {
    local_30._M_current =
         (NumericFilterCase *)
         std::
         vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
         begin(&this->_numericFilters);
    while( true ) {
      local_38._M_current =
           (NumericFilterCase *)
           std::
           vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
           end(&this->_numericFilters);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      pNVar3 = __gnu_cxx::
               __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
               ::operator->(&local_30);
      if (pNVar3->index < it._M_current._4_4_) {
        pNVar3 = __gnu_cxx::
                 __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
                 ::operator->(&local_30);
        pvVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                           (&data->super_vector<DataPoint,_std::allocator<DataPoint>_>,
                            (ulong)pNVar3->index);
        if ((pvVar4->active & 1U) != 0) {
          pNVar3 = __gnu_cxx::
                   __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
                   ::operator->(&local_30);
          pNVar5 = __gnu_cxx::
                   __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
                   ::operator->(&local_30);
          pvVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                             (&data->super_vector<DataPoint,_std::allocator<DataPoint>_>,
                              (ulong)pNVar5->index);
          bVar1 = NumericFilter::isFiltered(&pNVar3->filter,&pvVar4->value);
          if (bVar1) {
            return true;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_DataFilters::NumericFilterCase_*,_std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>_>
      ::operator++(&local_30);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
    isFiltered(DataVector const & data) const
    {
        unsigned int size = data.size();
        // Iterate through and check if any filter applies to this data point
        if (this->_numericFilters.size() == 0) return true;
        for (std::vector<NumericFilterCase>::const_iterator it = this->_numericFilters.begin(); it != this->_numericFilters.end(); ++it)
        {
            if (it->index >= size || !data.at(it->index).active) continue; // don't check if out-of-range or data is not active
            if (it->filter.isFiltered(data.at(it->index).value)) return true;
        }
        return false;
    }